

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_5_compatibility.cpp
# Opt level: O3

void __thiscall
QOpenGLFunctions_4_5_Compatibility::~QOpenGLFunctions_4_5_Compatibility
          (QOpenGLFunctions_4_5_Compatibility *this)

{
  QAtomicInt *pQVar1;
  
  (this->super_QAbstractOpenGLFunctions)._vptr_QAbstractOpenGLFunctions =
       (_func_int **)&PTR__QOpenGLFunctions_4_5_Compatibility_001a2080;
  if (this->d_1_0_Core != (QOpenGLFunctions_1_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Core != (QOpenGLFunctions_1_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Core != (QOpenGLFunctions_1_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_3_Core != (QOpenGLFunctions_1_3_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_3_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_4_Core != (QOpenGLFunctions_1_4_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_4_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_5_Core != (QOpenGLFunctions_1_5_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_5_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_2_0_Core != (QOpenGLFunctions_2_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_2_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_2_1_Core != (QOpenGLFunctions_2_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_2_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_0_Core != (QOpenGLFunctions_3_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_1_Core != (QOpenGLFunctions_3_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_2_Core != (QOpenGLFunctions_3_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_3_Core != (QOpenGLFunctions_3_3_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_3_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_0_Core != (QOpenGLFunctions_4_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_1_Core != (QOpenGLFunctions_4_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_2_Core != (QOpenGLFunctions_4_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_3_Core != (QOpenGLFunctions_4_3_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_3_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_4_Core != (QOpenGLFunctions_4_4_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_4_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_5_Core != (QOpenGLFunctions_4_5_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_5_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_0_Deprecated != (QOpenGLFunctions_1_0_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Deprecated != (QOpenGLFunctions_1_1_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Deprecated != (QOpenGLFunctions_1_2_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_3_Deprecated != (QOpenGLFunctions_1_3_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_3_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_4_Deprecated != (QOpenGLFunctions_1_4_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_4_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_3_3_Deprecated != (QOpenGLFunctions_3_3_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_3_3_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_4_5_Deprecated != (QOpenGLFunctions_4_5_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_4_5_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
    return;
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  return;
}

Assistant:

QOpenGLFunctions_4_5_Compatibility::~QOpenGLFunctions_4_5_Compatibility()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_2_0_Core) {
        d_2_0_Core->refs.deref();
        Q_ASSERT(d_2_0_Core->refs.loadRelaxed());
    }
    if (d_2_1_Core) {
        d_2_1_Core->refs.deref();
        Q_ASSERT(d_2_1_Core->refs.loadRelaxed());
    }
    if (d_3_0_Core) {
        d_3_0_Core->refs.deref();
        Q_ASSERT(d_3_0_Core->refs.loadRelaxed());
    }
    if (d_3_1_Core) {
        d_3_1_Core->refs.deref();
        Q_ASSERT(d_3_1_Core->refs.loadRelaxed());
    }
    if (d_3_2_Core) {
        d_3_2_Core->refs.deref();
        Q_ASSERT(d_3_2_Core->refs.loadRelaxed());
    }
    if (d_3_3_Core) {
        d_3_3_Core->refs.deref();
        Q_ASSERT(d_3_3_Core->refs.loadRelaxed());
    }
    if (d_4_0_Core) {
        d_4_0_Core->refs.deref();
        Q_ASSERT(d_4_0_Core->refs.loadRelaxed());
    }
    if (d_4_1_Core) {
        d_4_1_Core->refs.deref();
        Q_ASSERT(d_4_1_Core->refs.loadRelaxed());
    }
    if (d_4_2_Core) {
        d_4_2_Core->refs.deref();
        Q_ASSERT(d_4_2_Core->refs.loadRelaxed());
    }
    if (d_4_3_Core) {
        d_4_3_Core->refs.deref();
        Q_ASSERT(d_4_3_Core->refs.loadRelaxed());
    }
    if (d_4_4_Core) {
        d_4_4_Core->refs.deref();
        Q_ASSERT(d_4_4_Core->refs.loadRelaxed());
    }
    if (d_4_5_Core) {
        d_4_5_Core->refs.deref();
        Q_ASSERT(d_4_5_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
    if (d_1_3_Deprecated) {
        d_1_3_Deprecated->refs.deref();
        Q_ASSERT(d_1_3_Deprecated->refs.loadRelaxed());
    }
    if (d_1_4_Deprecated) {
        d_1_4_Deprecated->refs.deref();
        Q_ASSERT(d_1_4_Deprecated->refs.loadRelaxed());
    }
    if (d_3_3_Deprecated) {
        d_3_3_Deprecated->refs.deref();
        Q_ASSERT(d_3_3_Deprecated->refs.loadRelaxed());
    }
    if (d_4_5_Deprecated) {
        d_4_5_Deprecated->refs.deref();
        Q_ASSERT(d_4_5_Deprecated->refs.loadRelaxed());
    }
}